

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

void sptk::world::fast_fftfilt
               (double *x,int x_length,double *h,int h_length,int fft_size,
               ForwardRealFFT *forward_real_fft,InverseRealFFT *inverse_real_fft,double *y)

{
  undefined1 auVar1 [16];
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  ulong uVar2;
  void *pvVar3;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  fft_complex *x_spectrum;
  int local_12c;
  undefined1 local_128 [76];
  int local_dc;
  undefined1 local_d8 [56];
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int iVar4;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar5;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  int local_38;
  int local_34;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_R8D;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (local_34 = 0; local_38 = in_ESI, local_34 < in_ESI; local_34 = local_34 + 1) {
    *(double *)(*(long *)(in_R9 + 8) + (long)local_34 * 8) =
         *(double *)(in_RDI + (long)local_34 * 8) / (double)in_R8D;
  }
  for (; local_38 < in_R8D; local_38 = local_38 + 1) {
    *(undefined8 *)(*(long *)(in_R9 + 8) + (long)local_38 * 8) = 0;
  }
  memcpy(&stack0xffffffffffffff80,(void *)(in_R9 + 0x18),0x48);
  p._8_8_ = in_stack_ffffffffffffff68;
  p.n = (int)in_stack_ffffffffffffff60;
  p.sign = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  p.c_in._0_4_ = in_stack_ffffffffffffff70;
  p.c_in._4_4_ = in_stack_ffffffffffffff74;
  p.in._0_4_ = in_stack_ffffffffffffff78;
  p.in._4_4_ = in_stack_ffffffffffffff7c;
  p.c_out = (fft_complex *)in_stack_ffffffffffffff80;
  p.out = (double *)in_stack_ffffffffffffff88;
  p.input = (double *)in_stack_ffffffffffffff90;
  p.ip = (int *)in_stack_ffffffffffffff98;
  p.w = in_stack_ffffffffffffffa0;
  fft_execute(p);
  for (iVar5 = 0; iVar5 <= in_R8D / 2; iVar5 = iVar5 + 1) {
    *(undefined8 *)((long)pvVar3 + (long)iVar5 * 0x10) =
         *(undefined8 *)(*(long *)(in_R9 + 0x10) + (long)iVar5 * 0x10);
    *(undefined8 *)((long)pvVar3 + (long)iVar5 * 0x10 + 8) =
         *(undefined8 *)(*(long *)(in_R9 + 0x10) + (long)iVar5 * 0x10 + 8);
  }
  for (iVar4 = 0; iVar4 < in_ECX; iVar4 = iVar4 + 1) {
    *(double *)(*(long *)(in_R9 + 8) + (long)iVar4 * 8) =
         *(double *)(in_RDX + (long)iVar4 * 8) / (double)in_R8D;
  }
  for (; in_ECX < in_R8D; in_ECX = in_ECX + 1) {
    *(undefined8 *)(*(long *)(in_R9 + 8) + (long)in_ECX * 8) = 0;
  }
  memcpy(local_d8,(void *)(in_R9 + 0x18),0x48);
  p_00._8_8_ = in_stack_ffffffffffffff68;
  p_00.n = (int)in_stack_ffffffffffffff60;
  p_00.sign = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  p_00.c_in._0_4_ = in_stack_ffffffffffffff70;
  p_00.c_in._4_4_ = in_ECX;
  p_00.in._0_4_ = iVar4;
  p_00.in._4_4_ = iVar5;
  p_00.c_out = (fft_complex *)in_stack_ffffffffffffff80;
  p_00.out = (double *)in_stack_ffffffffffffff88;
  p_00.input = (double *)in_stack_ffffffffffffff90;
  p_00.ip = (int *)in_stack_ffffffffffffff98;
  p_00.w = in_stack_ffffffffffffffa0;
  fft_execute(p_00);
  for (local_dc = 0; local_dc <= in_R8D / 2; local_dc = local_dc + 1) {
    *(double *)(*(long *)(in_stack_00000008 + 0x10) + (long)local_dc * 0x10) =
         *(double *)((long)pvVar3 + (long)local_dc * 0x10) *
         *(double *)(*(long *)(in_R9 + 0x10) + (long)local_dc * 0x10) +
         -(*(double *)((long)pvVar3 + (long)local_dc * 0x10 + 8) *
          *(double *)(*(long *)(in_R9 + 0x10) + (long)local_dc * 0x10 + 8));
    *(double *)(*(long *)(in_stack_00000008 + 0x10) + (long)local_dc * 0x10 + 8) =
         *(double *)((long)pvVar3 + (long)local_dc * 0x10) *
         *(double *)(*(long *)(in_R9 + 0x10) + (long)local_dc * 0x10 + 8) +
         *(double *)((long)pvVar3 + (long)local_dc * 0x10 + 8) *
         *(double *)(*(long *)(in_R9 + 0x10) + (long)local_dc * 0x10);
  }
  memcpy(local_128,(void *)(in_stack_00000008 + 0x18),0x48);
  p_01._8_8_ = in_stack_ffffffffffffff68;
  p_01.n = (int)in_stack_ffffffffffffff60;
  p_01.sign = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  p_01.c_in._0_4_ = in_stack_ffffffffffffff70;
  p_01.c_in._4_4_ = in_ECX;
  p_01.in._0_4_ = iVar4;
  p_01.in._4_4_ = iVar5;
  p_01.c_out = (fft_complex *)in_stack_ffffffffffffff80;
  p_01.out = (double *)in_stack_ffffffffffffff88;
  p_01.input = (double *)in_stack_ffffffffffffff90;
  p_01.ip = (int *)in_stack_ffffffffffffff98;
  p_01.w = in_stack_ffffffffffffffa0;
  fft_execute(p_01);
  for (local_12c = 0; local_12c < in_R8D; local_12c = local_12c + 1) {
    *(undefined8 *)(in_stack_00000010 + (long)local_12c * 8) =
         *(undefined8 *)(*(long *)(in_stack_00000008 + 8) + (long)local_12c * 8);
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void fast_fftfilt(const double *x, int x_length, const double *h, int h_length,
    int fft_size, const ForwardRealFFT *forward_real_fft,
    const InverseRealFFT *inverse_real_fft, double *y) {
  fft_complex *x_spectrum = new fft_complex[fft_size];

  for (int i = 0; i < x_length; ++i)
    forward_real_fft->waveform[i] = x[i] / fft_size;
  for (int i = x_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i) {
    x_spectrum[i][0] = forward_real_fft->spectrum[i][0];
    x_spectrum[i][1] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < h_length; ++i)
    forward_real_fft->waveform[i] = h[i] / fft_size;
  for (int i = h_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);

  for (int i = 0; i <= fft_size / 2; ++i) {
    inverse_real_fft->spectrum[i][0] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][0] -
      x_spectrum[i][1] * forward_real_fft->spectrum[i][1];
    inverse_real_fft->spectrum[i][1] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][1] +
      x_spectrum[i][1] * forward_real_fft->spectrum[i][0];
  }
  fft_execute(inverse_real_fft->inverse_fft);

  for (int i = 0; i < fft_size; ++i)
    y[i] = inverse_real_fft->waveform[i];

  delete[] x_spectrum;
}